

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell.c
# Opt level: O0

int xmllintShellWrite(xmllintShellCtxtPtr ctxt,char *filename,xmlNodePtr node,xmlNodePtr node2)

{
  int iVar1;
  FILE *__stream;
  FILE *f;
  xmlNodePtr node2_local;
  xmlNodePtr node_local;
  char *filename_local;
  xmllintShellCtxtPtr ctxt_local;
  
  if (node == (xmlNodePtr)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else if ((filename == (char *)0x0) || (*filename == '\0')) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if (node->type == XML_DOCUMENT_NODE) {
      iVar1 = xmlSaveFile(filename,ctxt->doc);
      if (iVar1 < -1) {
        fprintf((FILE *)ctxt->output,"Failed to write to %s\n",filename);
        return -1;
      }
    }
    else if (node->type == XML_HTML_DOCUMENT_NODE) {
      iVar1 = htmlSaveFile(filename,ctxt->doc);
      if (iVar1 < 0) {
        fprintf((FILE *)ctxt->output,"Failed to write to %s\n",filename);
        return -1;
      }
    }
    else {
      __stream = fopen64(filename,"wb");
      if (__stream == (FILE *)0x0) {
        fprintf((FILE *)ctxt->output,"Failed to write to %s\n",filename);
        return -1;
      }
      xmlElemDump(__stream,ctxt->doc,node);
      fclose(__stream);
    }
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmllintShellWrite(xmllintShellCtxtPtr ctxt, char *filename, xmlNodePtr node,
              xmlNodePtr node2 ATTRIBUTE_UNUSED)
{
    if (node == NULL)
        return (-1);
    if ((filename == NULL) || (filename[0] == 0)) {
        return (-1);
    }
    switch (node->type) {
        case XML_DOCUMENT_NODE:
            if (xmlSaveFile((char *) filename, ctxt->doc) < -1) {
                fprintf(ctxt->output,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
            break;
        case XML_HTML_DOCUMENT_NODE:
#ifdef LIBXML_HTML_ENABLED
            if (htmlSaveFile((char *) filename, ctxt->doc) < 0) {
                fprintf(ctxt->output,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
#else
            if (xmlSaveFile((char *) filename, ctxt->doc) < -1) {
                fprintf(ctxt->output,
                                "Failed to write to %s\n", filename);
                return (-1);
            }
#endif /* LIBXML_HTML_ENABLED */
            break;
        default:{
                FILE *f;

                f = fopen((char *) filename, "wb");
                if (f == NULL) {
                    fprintf(ctxt->output,
                                    "Failed to write to %s\n", filename);
                    return (-1);
                }
                xmlElemDump(f, ctxt->doc, node);
                fclose(f);
            }
    }
    return (0);
}